

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

_func_void_int * putty_signal(int sig,_func_void_int *func)

{
  int iVar1;
  _union_1457 local_150;
  sigaction old;
  sigaction sa;
  _func_void_int *func_local;
  _union_1457 _Stack_10;
  int sig_local;
  
  old.sa_restorer = (_func_void *)func;
  sa.sa_restorer = (_func_void *)func;
  iVar1 = sigemptyset((sigset_t *)&sa);
  if (iVar1 < 0) {
    _Stack_10 = (_union_1457)0xffffffffffffffff;
  }
  else {
    sa.sa_mask.__val[0xf]._0_4_ = 0x10000000;
    iVar1 = sigaction(sig,(sigaction *)&old.sa_restorer,(sigaction *)&local_150);
    if (iVar1 < 0) {
      _Stack_10 = (_union_1457)0xffffffffffffffff;
    }
    else {
      _Stack_10 = local_150;
    }
  }
  return (_func_void_int *)_Stack_10.sa_handler;
}

Assistant:

void (*putty_signal(int sig, void (*func)(int)))(int)
{
    struct sigaction sa;
    struct sigaction old;

    sa.sa_handler = func;
    if(sigemptyset(&sa.sa_mask) < 0)
        return SIG_ERR;
    sa.sa_flags = SA_RESTART;
    if(sigaction(sig, &sa, &old) < 0)
        return SIG_ERR;
    return old.sa_handler;
}